

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O2

void __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::insert
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this,
          spectral_operation *trans)

{
  uint16_t uVar1;
  ulong uVar2;
  pointer psVar3;
  ulong uVar4;
  
  uVar4 = (ulong)this->transform_index;
  psVar3 = (this->transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->transforms).
                 super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3) / 6;
  if (uVar2 <= uVar4) {
    std::
    vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>::
    resize(&this->transforms,uVar2 * 2);
    uVar4 = (ulong)this->transform_index;
    psVar3 = (this->transforms).
             super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  this->transform_index = (int)uVar4 + 1;
  psVar3[uVar4]._var2 = trans->_var2;
  uVar1 = trans->_var1;
  psVar3[uVar4]._kind = trans->_kind;
  psVar3[uVar4]._var1 = uVar1;
  return;
}

Assistant:

void insert( const spectral_operation& trans )
  {
    if ( transform_index >= transforms.size() )
    {
      transforms.resize( transforms.size() << 1 );
    }
    assert( transform_index < transforms.size() );
    transforms[transform_index++] = trans;
  }